

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableExpression.hpp
# Opt level: O3

string * __thiscall
Kandinsky::VariableExpression::toString_abi_cxx11_
          (string *__return_storage_ptr__,VariableExpression *this,bool evaluate)

{
  pointer pcVar1;
  undefined7 in_register_00000011;
  double local_10;
  
  if ((int)CONCAT71(in_register_00000011,evaluate) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->m_name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->m_name)._M_string_length);
  }
  else {
    local_10 = this->m_value;
    if ((this->m_formatter).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
      return (string *)0x0;
    }
    (*(this->m_formatter)._M_invoker)
              (__return_storage_ptr__,(_Any_data *)&this->m_formatter,&local_10);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString(bool evaluate = false) const
        {
            return evaluate ? m_formatter(m_value) : m_name;
        }